

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_ps_static.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_ps_static::save(xr_level_ps_static *this,xr_writer *w)

{
  particle_data *ppVar1;
  bool bVar2;
  reference pppVar3;
  particle_data *particle;
  particle_data_vec_cit end;
  particle_data_vec_cit it;
  uint32_t id;
  xr_writer *w_local;
  xr_level_ps_static *this_local;
  
  it._M_current._4_1_ = this->m_version != 0;
  if (it._M_current._4_1_) {
    xr_writer::w_chunk<unsigned_int>(w,0,&this->m_version);
  }
  it._M_current._5_3_ = 0;
  end._M_current =
       (particle_data **)
       std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>::begin
                 (&this->m_particles);
  particle = (particle_data *)
             std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>::end
                       (&this->m_particles);
  while (bVar2 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<xray_re::particle_data_*const_*,_std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>_>
                                  *)&particle), bVar2) {
    pppVar3 = __gnu_cxx::
              __normal_iterator<xray_re::particle_data_*const_*,_std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>_>
              ::operator*(&end);
    ppVar1 = *pppVar3;
    xr_writer::open_chunk(w,it._M_current._4_4_);
    if (this->m_version != 0) {
      xr_writer::w_u16(w,ppVar1->extra);
    }
    xr_writer::w_sz(w,&ppVar1->reference);
    xr_writer::w<xray_re::_matrix<float>>(w,&ppVar1->xform);
    xr_writer::close_chunk(w);
    __gnu_cxx::
    __normal_iterator<xray_re::particle_data_*const_*,_std::vector<xray_re::particle_data_*,_std::allocator<xray_re::particle_data_*>_>_>
    ::operator++(&end);
    it._M_current._4_4_ = it._M_current._4_4_ + 1;
  }
  return;
}

Assistant:

void xr_level_ps_static::save(xr_writer& w) const
{
	uint32_t id;
	if (m_version == PS_VERSION_0) {
		id = 0;
	} else {
		id = 1;
		w.w_chunk(PS_CHUNK_VERSION, m_version);
	}
	for (particle_data_vec_cit it = m_particles.begin(), end = m_particles.end();
			it != end; ++it, ++id) {
		const particle_data* particle = *it;
		w.open_chunk(id);
		if (m_version != PS_VERSION_0)
			w.w_u16(particle->extra);
		w.w_sz(particle->reference);
		w.w(particle->xform);
		w.close_chunk();
	}
}